

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O1

Result __thiscall
wabt::TypeChecker::PopAndCheck2Types(TypeChecker *this,Type expected1,Type expected2,char *desc)

{
  byte bVar1;
  Result RVar2;
  bool bVar3;
  bool bVar4;
  Type local_48;
  Type local_44;
  char *pcStack_40;
  Type actual;
  byte local_31;
  
  local_44 = Any;
  pcStack_40 = desc;
  RVar2 = PeekType(this,0,&local_44);
  bVar3 = local_44 != expected2;
  bVar4 = local_44 != Any;
  local_31 = RVar2.enum_ == Error;
  local_48 = Any;
  RVar2 = PeekType(this,1,&local_48);
  bVar1 = RVar2.enum_ == Error | local_31 | ((bVar4 && expected2 != Any) && bVar3) |
          ((local_48 != Any && expected1 != Any) && local_48 != expected1);
  PrintStackIfFailed<wabt::Type,wabt::Type>
            (this,(Result)(bVar1 & Error),pcStack_40,expected1,expected2);
  RVar2 = DropTypes(this,2);
  return (Result)((bVar1 | RVar2.enum_ == Error) & Error);
}

Assistant:

Result TypeChecker::PopAndCheck2Types(Type expected1,
                                      Type expected2,
                                      const char* desc) {
  Result result = Result::Ok;
  result |= PeekAndCheckType(0, expected2);
  result |= PeekAndCheckType(1, expected1);
  PrintStackIfFailed(result, desc, expected1, expected2);
  result |= DropTypes(2);
  return result;
}